

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O3

void __thiscall crnlib::crn_comp::optimize_color(crn_comp *this)

{
  int *piVar1;
  bool bVar2;
  uint8 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  endpoint_indices_details *peVar8;
  undefined4 uVar9;
  ushort uVar10;
  uint uVar11;
  uint uVar12;
  long *pData_ptr;
  executable_task *pObj;
  uint __tmp_4;
  uint uVar13;
  uint uVar14;
  undefined4 uVar15;
  unsigned_short *__tmp_3;
  ulong uVar16;
  unsigned_short *puVar17;
  unsigned_short *puVar18;
  undefined2 uVar19;
  uint uVar20;
  uint __tmp_1;
  uint uVar21;
  uint uVar22;
  uchar *__tmp;
  uchar *puVar23;
  uchar *puVar24;
  uint8 uVar25;
  long lVar26;
  dxt1_block *pdVar27;
  uint uVar28;
  undefined4 *puVar29;
  uint i;
  uint64 data;
  vector<crnlib::optimize_color_params::unpacked_endpoint> unpacked_endpoints;
  vector<unsigned_int> sum;
  vector<unsigned_int> hist;
  result remapping_trial [4];
  elemental_vector local_118;
  elemental_vector local_108;
  elemental_vector local_f8;
  task_pool *local_e8;
  undefined8 local_e0;
  dxt1_block local_d8;
  undefined8 uStack_d0;
  uint8 local_c8 [24];
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  
  uVar11 = (this->m_color_endpoints).m_size;
  local_e0 = (ulong)uVar11;
  uVar10 = (ushort)uVar11;
  local_f8.m_p = (void *)0x0;
  local_f8.m_size = 0;
  local_f8.m_capacity = 0;
  if ((ulong)uVar10 == 0) {
    local_108.m_p = (void *)0x0;
    local_108.m_size = 0;
    local_108.m_capacity = 0;
  }
  else {
    uVar14 = (uVar11 & 0xffff) * (uVar11 & 0xffff);
    elemental_vector::increase_capacity(&local_f8,uVar14,uVar14 == 1,4,(object_mover)0x0,false);
    memset((void *)((local_f8._8_8_ & 0xffffffff) * 4 + (long)local_f8.m_p),0,
           (ulong)(uVar14 - local_f8.m_size) << 2);
    local_f8.m_size = uVar14;
    local_108.m_p = (void *)0x0;
    local_108.m_size = 0;
    local_108.m_capacity = 0;
    uVar28 = uVar11 & 0xffff;
    elemental_vector::increase_capacity(&local_108,uVar28,uVar28 == 1,4,(object_mover)0x0,false);
    memset((void *)((local_108._8_8_ & 0xffffffff) * 4 + (long)local_108.m_p),0,
           (ulong)(uVar28 - local_108.m_size) << 2);
    local_108._8_8_ = CONCAT44(local_108.m_capacity,uVar11) & 0xffffffff0000ffff;
  }
  uVar14 = (this->m_endpoint_indices).m_size;
  uVar28 = uVar11 & 0xffff;
  if (uVar14 != 0) {
    peVar8 = (this->m_endpoint_indices).m_p;
    bVar2 = this->m_has_subblocks;
    uVar16 = 0;
    uVar21 = 0;
    do {
      uVar22 = (uint)peVar8[uVar16].field_0.field_0.color;
      uVar3 = peVar8[uVar16].reference;
      uVar25 = uVar3;
      if (bVar2 == false) {
        uVar25 = uVar3 == '\0';
      }
      if ((uVar16 & 1) == 0) {
        uVar25 = uVar3 == '\0';
      }
      if ((uVar25 != '\0') && (uVar21 != uVar22)) {
        piVar1 = (int *)((long)local_f8.m_p + (ulong)(uVar28 * uVar22 + uVar21) * 4);
        *piVar1 = *piVar1 + 1;
        piVar1 = (int *)((long)local_f8.m_p + (ulong)(uVar21 * uVar28 + uVar22) * 4);
        *piVar1 = *piVar1 + 1;
        piVar1 = (int *)((long)local_108.m_p + (ulong)uVar22 * 4);
        *piVar1 = *piVar1 + 1;
        piVar1 = (int *)((long)local_108.m_p + (ulong)uVar21 * 4);
        *piVar1 = *piVar1 + 1;
        uVar14 = (this->m_endpoint_indices).m_size;
      }
      uVar16 = uVar16 + 1;
      uVar21 = uVar22;
    } while (uVar16 < uVar14);
  }
  if (uVar28 == 0) {
    local_118.m_p = (void *)0x0;
    local_118.m_size = 0;
    local_118.m_capacity = 0;
    uVar19 = 0;
  }
  else {
    uVar16 = 0;
    uVar28 = 0;
    uVar15 = 0;
    do {
      uVar21 = *(uint *)((long)local_108.m_p + uVar16 * 4);
      uVar9 = (int)uVar16;
      if (uVar21 <= uVar28) {
        uVar9 = uVar15;
      }
      uVar15 = uVar9;
      uVar19 = (undefined2)uVar15;
      if (uVar28 <= uVar21) {
        uVar28 = uVar21;
      }
      uVar16 = uVar16 + 1;
    } while (uVar10 != uVar16);
    local_118.m_p = (void *)0x0;
    local_118.m_size = 0;
    local_118.m_capacity = 0;
    uVar28 = uVar11 & 0xffff;
    if (uVar28 != 0) {
      elemental_vector::increase_capacity
                (&local_118,uVar28,uVar28 == 1,8,
                 vector<crnlib::optimize_color_params::unpacked_endpoint>::object_mover,false);
      local_118._8_8_ = CONCAT44(local_118.m_capacity,uVar11) & 0xffffffff0000ffff;
      lVar26 = 0;
      do {
        uVar11 = (this->m_color_endpoints).m_p[lVar26];
        if (this->m_has_etc_color_blocks == true) {
          uVar11 = uVar11 & 0xffffff;
        }
        else {
          dxt1_block::unpack_color(&local_d8,(uint16)uVar11,true,0xff);
          uVar11 = local_d8._0_4_;
        }
        *(uint *)((long)local_118.m_p + lVar26 * 8) = uVar11;
        uVar11 = (this->m_color_endpoints).m_p[lVar26];
        if (this->m_has_etc_color_blocks == true) {
          uVar11 = uVar11 >> 0x18;
        }
        else {
          dxt1_block::unpack_color(&local_d8,(uint16)(uVar11 >> 0x10),true,0xff);
          uVar11 = local_d8._0_4_;
        }
        *(uint *)((long)local_118.m_p + lVar26 * 8 + 4) = uVar11;
        lVar26 = lVar26 + 1;
      } while ((ushort)lVar26 < uVar10);
    }
  }
  pdVar27 = &local_d8;
  local_c8[0] = '\0';
  local_c8[1] = '\0';
  local_c8[2] = '\0';
  local_c8[3] = '\0';
  local_c8[4] = '\0';
  local_c8[5] = '\0';
  local_c8[6] = '\0';
  local_c8[7] = '\0';
  local_c8[8] = '\0';
  local_c8[9] = '\0';
  local_c8[10] = '\0';
  local_c8[0xb] = '\0';
  local_c8[0xc] = '\0';
  local_c8[0xd] = '\0';
  local_c8[0xe] = '\0';
  local_c8[0xf] = '\0';
  local_d8.m_low_color[0] = '\0';
  local_d8.m_low_color[1] = '\0';
  local_d8.m_high_color[0] = '\0';
  local_d8.m_high_color[1] = '\0';
  local_d8.m_selectors[0] = '\0';
  local_d8.m_selectors[1] = '\0';
  local_d8.m_selectors[2] = '\0';
  local_d8.m_selectors[3] = '\0';
  uStack_d0 = 0;
  local_b0 = 0;
  uStack_a8 = 0;
  local_a0 = 0;
  uStack_98 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_60 = 0;
  uStack_58 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_e8 = &this->m_task_pool;
  puVar29 = &DAT_001b0280;
  data = 0;
  do {
    pData_ptr = (long *)crnlib_malloc(0x20);
    *pData_ptr = (long)local_118.m_p;
    pData_ptr[1] = (long)local_f8.m_p;
    *(short *)(pData_ptr + 2) = (short)local_e0;
    *(undefined2 *)((long)pData_ptr + 0x12) = uVar19;
    *(undefined4 *)((long)pData_ptr + 0x14) = *puVar29;
    pData_ptr[3] = (long)pdVar27;
    pObj = (executable_task *)crnlib_malloc(0x28);
    pObj->_vptr_executable_task = (_func_int **)&PTR_execute_task_001d2928;
    pObj[1]._vptr_executable_task = (_func_int **)this;
    pObj[2]._vptr_executable_task = (_func_int **)optimize_color_endpoints_task;
    pObj[3]._vptr_executable_task = (_func_int **)0x0;
    *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
    task_pool::queue_task(local_e8,pObj,data,pData_ptr);
    data = data + 1;
    puVar29 = puVar29 + 1;
    pdVar27 = pdVar27 + 5;
  } while (data != 4);
  task_pool::join(local_e8);
  uVar14 = (this->m_packed_color_endpoints).m_size;
  uVar20 = (this->m_packed_color_endpoints).m_capacity;
  uVar13 = this->m_endpoint_remaping[0].m_size;
  uVar12 = this->m_endpoint_remaping[0].m_capacity;
  uVar11 = 0xffffffff;
  lVar26 = 0x20;
  puVar17 = this->m_endpoint_remaping[0].m_p;
  puVar23 = (this->m_packed_color_endpoints).m_p;
  do {
    uVar28 = *(uint *)(local_d8.m_low_color + lVar26);
    puVar18 = puVar17;
    puVar24 = puVar23;
    if (uVar28 < uVar11) {
      puVar24 = *(uchar **)((long)&local_e8 + lVar26);
      (this->m_packed_color_endpoints).m_p = puVar24;
      *(uchar **)((long)&local_e8 + lVar26) = puVar23;
      uVar4 = *(uint *)((long)&local_e0 + lVar26);
      (this->m_packed_color_endpoints).m_size = uVar4;
      *(uint *)((long)&local_e0 + lVar26) = uVar14;
      uVar5 = *(uint *)((long)&local_e0 + lVar26 + 4);
      (this->m_packed_color_endpoints).m_capacity = uVar5;
      *(uint *)((long)&local_e0 + lVar26 + 4) = uVar20;
      puVar18 = *(unsigned_short **)((long)&local_f8.m_p + lVar26);
      this->m_endpoint_remaping[0].m_p = puVar18;
      *(unsigned_short **)((long)&local_f8.m_p + lVar26) = puVar17;
      uVar6 = *(uint *)((long)&local_f8.m_size + lVar26);
      this->m_endpoint_remaping[0].m_size = uVar6;
      *(uint *)((long)&local_f8.m_size + lVar26) = uVar13;
      uVar7 = *(uint *)((long)&local_f8.m_capacity + lVar26);
      this->m_endpoint_remaping[0].m_capacity = uVar7;
      *(uint *)((long)&local_f8.m_capacity + lVar26) = uVar12;
      uVar14 = uVar4;
      uVar20 = uVar5;
      uVar13 = uVar6;
      uVar12 = uVar7;
      uVar11 = uVar28;
    }
    lVar26 = lVar26 + 0x28;
    puVar17 = puVar18;
    puVar23 = puVar24;
  } while (lVar26 != 0xc0);
  lVar26 = 0x78;
  do {
    if (*(void **)((&local_d8)[2].m_low_color + lVar26) != (void *)0x0) {
      crnlib_free(*(void **)((&local_d8)[2].m_low_color + lVar26));
    }
    if (*(void **)(local_d8.m_low_color + lVar26) != (void *)0x0) {
      crnlib_free(*(void **)(local_d8.m_low_color + lVar26));
    }
    lVar26 = lVar26 + -0x28;
  } while (lVar26 != -0x28);
  if (local_118.m_p != (void *)0x0) {
    crnlib_free(local_118.m_p);
  }
  if (local_108.m_p != (void *)0x0) {
    crnlib_free(local_108.m_p);
  }
  if (local_f8.m_p != (void *)0x0) {
    crnlib_free(local_f8.m_p);
  }
  return;
}

Assistant:

void crn_comp::optimize_color()
    {
        uint16 n = m_color_endpoints.size();
        crnlib::vector<uint> hist(n * n);
        crnlib::vector<uint> sum(n);
        for (uint i, i_prev = 0, b = 0; b < m_endpoint_indices.size(); b++, i_prev = i)
        {
            i = m_endpoint_indices[b].color;
            if ((m_has_subblocks && b & 1 ? m_endpoint_indices[b].reference : !m_endpoint_indices[b].reference) && i != i_prev)
            {
                hist[i * n + i_prev]++;
                hist[i_prev * n + i]++;
                sum[i]++;
                sum[i_prev]++;
            }
        }
        uint16 selected = 0;
        uint best_sum = 0;
        for (uint16 i = 0; i < n; i++)
        {
            if (best_sum < sum[i])
            {
                best_sum = sum[i];
                selected = i;
            }
        }
        crnlib::vector<optimize_color_params::unpacked_endpoint> unpacked_endpoints(n);
        for (uint16 i = 0; i < n; i++)
        {
            unpacked_endpoints[i].low.m_u32 = m_has_etc_color_blocks ? m_color_endpoints[i] & 0xFFFFFF : dxt1_block::unpack_color(m_color_endpoints[i] & 0xFFFF, true).m_u32;
            unpacked_endpoints[i].high.m_u32 = m_has_etc_color_blocks ? m_color_endpoints[i] >> 24 : dxt1_block::unpack_color(m_color_endpoints[i] >> 16, true).m_u32;
        }

        optimize_color_params::result remapping_trial[4];
        float weights[4] = { 0, 0, 1.0f / 6.0f, 0.5f };
        for (uint i = 0; i < 4; i++)
        {
            optimize_color_params* pParams = crnlib_new<optimize_color_params>();
            pParams->unpacked_endpoints = unpacked_endpoints.get_ptr();
            pParams->hist = hist.get_ptr();
            pParams->n = n;
            pParams->selected = selected;
            pParams->weight = weights[i];
            pParams->pResult = remapping_trial + i;
            m_task_pool.queue_object_task(this, &crn_comp::optimize_color_endpoints_task, i, pParams);
        }
        m_task_pool.join();

        for (uint best_bits = cUINT32_MAX, i = 0; i < 4; i++)
        {
            if (remapping_trial[i].total_bits < best_bits)
            {
                m_packed_color_endpoints.swap(remapping_trial[i].packed_endpoints);
                m_endpoint_remaping[cColor].swap(remapping_trial[i].endpoint_remapping);
                best_bits = remapping_trial[i].total_bits;
            }
        }
    }